

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_test.cpp
# Opt level: O3

void TestEventComparisonNode(void)

{
  pointer pcVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bool bVar5;
  EventComparisonNode greater;
  Date january_1;
  EventComparisonNode equal;
  EventComparisonNode less_eq;
  string local_f8;
  undefined1 local_d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  Date local_a8;
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  string local_68;
  EventComparisonNode local_48;
  
  local_a8.day = 1;
  local_a8.year = 0x7b2;
  local_a8.month = 1;
  local_d8._0_4_ = 1;
  pcVar1 = local_98 + 0x10;
  local_98._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"b","");
  EventComparisonNode::EventComparisonNode(&local_48,(Comparison *)local_d8,(string *)local_98);
  if ((pointer)local_98._0_8_ != pcVar1) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  local_98._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"a","");
  bVar5 = EventComparisonNode::Evaluate(&local_48,&local_a8,(string *)local_98);
  pcVar2 = local_d8 + 0x10;
  local_d8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"EventComparisonNode: less_eq 1","");
  Assert(bVar5,(string *)local_d8);
  if ((pointer)local_d8._0_8_ != pcVar2) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  if ((pointer)local_98._0_8_ != pcVar1) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  local_98._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"c","");
  bVar5 = EventComparisonNode::Evaluate(&local_48,&local_a8,(string *)local_98);
  local_d8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"EventComparisonNode: less_eq 2","");
  Assert(!bVar5,(string *)local_d8);
  if ((pointer)local_d8._0_8_ != pcVar2) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  if ((pointer)local_98._0_8_ != pcVar1) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  local_98._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"b","");
  bVar5 = EventComparisonNode::Evaluate(&local_48,&local_a8,(string *)local_98);
  local_d8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"EventComparisonNode: less_eq 3","");
  Assert(bVar5,(string *)local_d8);
  if ((pointer)local_d8._0_8_ != pcVar2) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  if ((pointer)local_98._0_8_ != pcVar1) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  local_f8._M_dataplus._M_p._0_4_ = 4;
  local_d8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"b","");
  EventComparisonNode::EventComparisonNode
            ((EventComparisonNode *)local_98,(Comparison *)&local_f8,(string *)local_d8);
  if ((pointer)local_d8._0_8_ != pcVar2) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  local_d8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"b","");
  bVar5 = EventComparisonNode::Evaluate
                    ((EventComparisonNode *)local_98,&local_a8,(string *)local_d8);
  paVar3 = &local_f8.field_2;
  local_f8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"EventComparisonNode: equal 1","");
  Assert(bVar5,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar3) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_d8._0_8_ != pcVar2) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  local_d8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"a","");
  bVar5 = EventComparisonNode::Evaluate
                    ((EventComparisonNode *)local_98,&local_a8,(string *)local_d8);
  local_f8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"EventComparisonNode: equal 2","");
  Assert(!bVar5,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar3) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_d8._0_8_ != pcVar2) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  local_d8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"c","");
  bVar5 = EventComparisonNode::Evaluate
                    ((EventComparisonNode *)local_98,&local_a8,(string *)local_d8);
  local_f8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"EventComparisonNode: equal 3","");
  Assert(!bVar5,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar3) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_d8._0_8_ != pcVar2) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  local_68._M_dataplus._M_p._0_4_ = 2;
  local_f8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"b","");
  EventComparisonNode::EventComparisonNode
            ((EventComparisonNode *)local_d8,(Comparison *)&local_68,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar3) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_f8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"c","");
  bVar5 = EventComparisonNode::Evaluate((EventComparisonNode *)local_d8,&local_a8,&local_f8);
  paVar4 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"EventComparisonNode: greater 1","");
  Assert(bVar5,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar4) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar3) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_f8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"b","");
  bVar5 = EventComparisonNode::Evaluate((EventComparisonNode *)local_d8,&local_a8,&local_f8);
  local_68._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"EventComparisonNode: greater 2","");
  Assert(!bVar5,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar4) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar3) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_f8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"a","");
  bVar5 = EventComparisonNode::Evaluate((EventComparisonNode *)local_d8,&local_a8,&local_f8);
  local_68._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"EventComparisonNode: greater 3","");
  Assert(!bVar5,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar4) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar3) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_d8._0_8_ = &PTR_Evaluate_00118c30;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._16_8_ != &local_b8) {
    operator_delete((void *)local_d8._16_8_,local_b8._M_allocated_capacity + 1);
  }
  local_98._0_8_ = &PTR_Evaluate_00118c30;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._16_8_ != &local_78) {
    operator_delete((void *)local_98._16_8_,local_78._M_allocated_capacity + 1);
  }
  local_48.super_Node._vptr_Node = (_func_int **)&PTR_Evaluate_00118c30;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.event._M_dataplus._M_p != &local_48.event.field_2) {
    operator_delete(local_48.event._M_dataplus._M_p,local_48.event.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

void TestEventComparisonNode() {
    const Date january_1{1970, 1, 1};

    EventComparisonNode less_eq(Comparison::LessOrEqual, "b");
    Assert(less_eq.Evaluate(january_1, "a"), "EventComparisonNode: less_eq 1");
    Assert(!less_eq.Evaluate(january_1, "c"), "EventComparisonNode: less_eq 2");
    Assert(less_eq.Evaluate(january_1, "b"), "EventComparisonNode: less_eq 3");

    EventComparisonNode equal(Comparison::Equal, "b");
    Assert(equal.Evaluate(january_1, "b"), "EventComparisonNode: equal 1");
    Assert(!equal.Evaluate(january_1, "a"), "EventComparisonNode: equal 2");
    Assert(!equal.Evaluate(january_1, "c"), "EventComparisonNode: equal 3");

    EventComparisonNode greater(Comparison::Greater, "b");
    Assert(greater.Evaluate(january_1, "c"), "EventComparisonNode: greater 1");
    Assert(!greater.Evaluate(january_1, "b"), "EventComparisonNode: greater 2");
    Assert(!greater.Evaluate(january_1, "a"), "EventComparisonNode: greater 3");
}